

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitData
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayInitData *curr,
          optional<wasm::HeapType> ht)

{
  bool bVar1;
  Expression **ppEVar2;
  HeapType *pHVar3;
  Type local_58;
  Type local_50;
  Type local_48;
  uintptr_t local_40;
  Type local_38;
  HeapType local_30;
  ArrayInitData *local_28;
  ArrayInitData *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ht_local;
  
  this_local = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_28 = curr;
  curr_local = (ArrayInitData *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    local_30 = wasm::Type::getHeapType(&local_28->ref->type);
    std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&this_local,&local_30);
  }
  ppEVar2 = &local_28->ref;
  pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
  local_40 = pHVar3->id;
  wasm::Type::Type(&local_38,(HeapType)local_40,Nullable,Inexact);
  note(this,ppEVar2,local_38);
  ppEVar2 = &local_28->index;
  wasm::Type::Type(&local_48,i32);
  note(this,ppEVar2,local_48);
  ppEVar2 = &local_28->offset;
  wasm::Type::Type(&local_50,i32);
  note(this,ppEVar2,local_50);
  ppEVar2 = &local_28->size;
  wasm::Type::Type(&local_58,i32);
  note(this,ppEVar2,local_58);
  return;
}

Assistant:

void visitArrayInitData(ArrayInitData* curr,
                          std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->index, Type::i32);
    note(&curr->offset, Type::i32);
    note(&curr->size, Type::i32);
  }